

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

bool fmt::v9::detail::check_char_specs<char,fmt::v9::detail::error_handler>
               (basic_format_specs<char> *specs,error_handler *eh)

{
  error_handler *in_RSI;
  error_handler *in_RDI;
  bool local_1;
  
  if (((in_RDI[8] == (error_handler)0x0) || (in_RDI[8] == (error_handler)0xf)) ||
     (in_RDI[8] == (error_handler)0x12)) {
    if (((((byte)*(undefined2 *)(in_RDI + 9) & 0xf) == 4) ||
        ((*(ushort *)(in_RDI + 9) >> 4 & 7) != 0)) || ((*(ushort *)(in_RDI + 9) >> 7 & 1) != 0)) {
      error_handler::on_error(in_RDI,(char *)in_RSI);
    }
    local_1 = true;
  }
  else {
    check_int_type_spec<fmt::v9::detail::error_handler&>
              ((presentation_type)((ulong)in_RDI >> 0x38),in_RSI);
    local_1 = false;
  }
  return local_1;
}

Assistant:

FMT_CONSTEXPR auto check_char_specs(const basic_format_specs<Char>& specs,
                                    ErrorHandler&& eh = {}) -> bool {
  if (specs.type != presentation_type::none &&
      specs.type != presentation_type::chr &&
      specs.type != presentation_type::debug) {
    check_int_type_spec(specs.type, eh);
    return false;
  }
  if (specs.align == align::numeric || specs.sign != sign::none || specs.alt)
    eh.on_error("invalid format specifier for char");
  return true;
}